

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_input_auth(Curl_easy *data,_Bool proxy,char *auth)

{
  _Bool _Var1;
  char *pcVar2;
  CURLcode local_34;
  auth *paStack_30;
  CURLcode result;
  auth *authp;
  unsigned_long *availp;
  char *auth_local;
  Curl_easy *pCStack_10;
  _Bool proxy_local;
  Curl_easy *data_local;
  
  local_34 = CURLE_OK;
  availp = (unsigned_long *)auth;
  auth_local._7_1_ = proxy;
  pCStack_10 = data;
  if (proxy) {
    authp = (auth *)&(data->info).proxyauthavail;
    paStack_30 = &(data->state).authproxy;
  }
  else {
    authp = (auth *)&(data->info).httpauthavail;
    paStack_30 = &(data->state).authhost;
  }
  while( true ) {
    if ((char)*availp == '\0') {
      return local_34;
    }
    if ((local_34 == CURLE_OK) && (_Var1 = authcmp("NTLM",(char *)availp), _Var1)) {
      local_34 = auth_ntlm(pCStack_10,(_Bool)(auth_local._7_1_ & 1),(char *)availp,paStack_30,
                           &authp->want);
    }
    if ((local_34 == CURLE_OK) && (_Var1 = authcmp("Digest",(char *)availp), _Var1)) {
      local_34 = auth_digest(pCStack_10,(_Bool)(auth_local._7_1_ & 1),(char *)availp,paStack_30,
                             &authp->want);
    }
    if ((local_34 == CURLE_OK) && (_Var1 = authcmp("Basic",(char *)availp), _Var1)) {
      local_34 = auth_basic(pCStack_10,paStack_30,&authp->want);
    }
    _Var1 = authcmp("Bearer",(char *)availp);
    if (_Var1) {
      local_34 = auth_bearer(pCStack_10,paStack_30,&authp->want);
    }
    if (local_34 != CURLE_OK) break;
    pcVar2 = strchr((char *)availp,0x2c);
    if (pcVar2 == (char *)0x0) {
      return CURLE_OK;
    }
    availp = (unsigned_long *)(pcVar2 + 1);
    Curl_str_passblanks((char **)&availp);
  }
  return local_34;
}

Assistant:

CURLcode Curl_http_input_auth(struct Curl_easy *data, bool proxy,
                              const char *auth) /* the first non-space */
{
  /*
   * This resource requires authentication
   */
#if defined(USE_SPNEGO) ||                      \
  defined(USE_NTLM) ||                          \
  !defined(CURL_DISABLE_DIGEST_AUTH) ||         \
  !defined(CURL_DISABLE_BASIC_AUTH) ||          \
  !defined(CURL_DISABLE_BEARER_AUTH)

  unsigned long *availp;
  struct auth *authp;
  CURLcode result = CURLE_OK;
  DEBUGASSERT(auth);
  DEBUGASSERT(data);

  if(proxy) {
    availp = &data->info.proxyauthavail;
    authp = &data->state.authproxy;
  }
  else {
    availp = &data->info.httpauthavail;
    authp = &data->state.authhost;
  }

  /*
   * Here we check if we want the specific single authentication (using ==) and
   * if we do, we initiate usage of it.
   *
   * If the provided authentication is wanted as one out of several accepted
   * types (using &), we OR this authentication type to the authavail
   * variable.
   *
   * Note:
   *
   * ->picked is first set to the 'want' value (one or more bits) before the
   * request is sent, and then it is again set _after_ all response 401/407
   * headers have been received but then only to a single preferred method
   * (bit).
   */

  while(*auth) {
#ifdef USE_SPNEGO
    if(authcmp("Negotiate", auth))
      result = auth_spnego(data, proxy, auth, authp, availp);
#endif
#ifdef USE_NTLM
    if(!result && authcmp("NTLM", auth))
      result = auth_ntlm(data, proxy, auth, authp, availp);
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
    if(!result && authcmp("Digest", auth))
      result = auth_digest(data, proxy, auth, authp, availp);
#endif
#ifndef CURL_DISABLE_BASIC_AUTH
    if(!result && authcmp("Basic", auth))
      result = auth_basic(data, authp, availp);
#endif
#ifndef CURL_DISABLE_BEARER_AUTH
    if(authcmp("Bearer", auth))
      result = auth_bearer(data, authp, availp);
#endif

    if(result)
      break;

    /* there may be multiple methods on one line, so keep reading */
    auth = strchr(auth, ',');
    if(auth) /* if we are on a comma, skip it */
      auth++;
    else
      break;
    Curl_str_passblanks(&auth);
  }
  return result;
#else
  (void) proxy;
  /* nothing to do when disabled */
  return CURLE_OK;
#endif
}